

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

String * __thiscall asl::String::trim(String *this)

{
  size_t __n;
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  
  uVar4 = this->_len;
  if (this->_size == 0) {
    __dest = &this->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  uVar3 = 0;
  if (0 < (int)uVar4) {
    do {
      bVar1 = __dest->_space[uVar3];
      if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
         ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) goto LAB_0011ab63;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    uVar3 = (ulong)uVar4;
  }
LAB_0011ab63:
  iVar2 = (int)uVar3;
  if (iVar2 < (int)uVar4) {
    lVar6 = (long)(int)uVar4;
    while( true ) {
      uVar4 = uVar4 - 1;
      bVar1 = __dest->_space[lVar6 + -1];
      uVar5 = uVar4;
      if ((' ' < (char)bVar1) || (0x20 < bVar1)) break;
      if (((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0) ||
         (lVar6 = lVar6 + -1, uVar5 = iVar2 - 1, lVar6 <= iVar2)) break;
    }
  }
  else {
    uVar5 = uVar4 - 1;
  }
  __n = (long)(int)(uVar5 - iVar2) + 1;
  memmove(__dest,(char *)((uVar3 & 0xffffffff) + (long)__dest),__n);
  __dest->_space[(long)(int)(uVar5 - iVar2) + 1] = '\0';
  this->_len = (int)__n;
  return this;
}

Assistant:

String& String::trim()
{
	int i, j, n = _len;
	char* s = str();
	for (i = 0; i<n; i++)
		if (!myisspace(s[i])) break;
	for (j = n - 1; j >= i; j--)
		if (!myisspace(s[j])) break;
	memmove(s, s + i, j - i + 1);
	s[j - i + 1] = '\0';
	_len = j - i + 1;
	return *this;
}